

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model-base-ekf-flex-estimator-imu.cpp
# Opt level: O1

void __thiscall
stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setUnmodeledForceVariance
          (ModelBaseEKFFlexEstimatorIMU *this,double d)

{
  ExtendedKalmanFilter *this_00;
  long lVar1;
  double dVar2;
  double *pdVar3;
  Index IVar4;
  Index IVar5;
  long lVar6;
  long lVar7;
  Pmatrix local_30;
  
  this->unmodeledForceVariance_ = d;
  if (0.0 < d) {
    setWithUnmodeledForces(this,true);
  }
  this_00 = &(this->super_EKFFlexibilityEstimatorBase).ekf_;
  KalmanFilterBase::getStateCovariance(&local_30,&this_00->super_KalmanFilterBase);
  pdVar3 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       local_30.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
  IVar4 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       local_30.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
  IVar5 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       local_30.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
  local_30.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       pdVar3;
  local_30.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = IVar4
  ;
  local_30.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = IVar5
  ;
  free(pdVar3);
  lVar7 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols;
  if ((lVar7 < 0) ||
     (lVar6 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_rows, lVar6 < 0)) {
    __assert_fail("a_index <= m_matrix.cols() && -a_index <= m_matrix.rows()",
                  "/usr/include/eigen3/Eigen/src/Core/Diagonal.h",0x4b,
                  "Eigen::Diagonal<Eigen::Matrix<double, -1, -1>>::Diagonal(MatrixType &, Index) [MatrixType = Eigen::Matrix<double, -1, -1>, Index = 0]"
                 );
  }
  if (lVar6 <= lVar7) {
    lVar7 = lVar6;
  }
  if (0x1d < lVar7) {
    pdVar3 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data;
    lVar7 = lVar6 + 1;
    lVar1 = lVar6 * 8 + 8;
    dVar2 = this->unmodeledForceVariance_;
    pdVar3[lVar1 * 3] = dVar2;
    pdVar3[lVar1 * 3 + lVar6 + 1] = dVar2;
    pdVar3[lVar1 * 3 + lVar7 * 2] = dVar2;
    pdVar3[lVar1 * 3 + lVar6 * 3 + 3] = dVar2;
    pdVar3[lVar1 * 3 + lVar7 * 4] = dVar2;
    pdVar3[lVar1 * 3 + lVar7 * 5] = dVar2;
    KalmanFilterBase::setStateCovariance(&this_00->super_KalmanFilterBase,&this->P_);
    return;
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Diagonal<Eigen::Matrix<double, -1, -1>>, 6, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Diagonal<Eigen::Matrix<double, -1, -1>>, BlockRows = 6, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ModelBaseEKFFlexEstimatorIMU::setUnmodeledForceVariance(double d)
    {
        unmodeledForceVariance_ = d;
        if (d>0)
        {
          setWithUnmodeledForces(true);
        }
        P_=ekf_.getStateCovariance();
        P_.diagonal().segment<6>(state::unmodeledForces).setConstant(unmodeledForceVariance_);
        ekf_.setStateCovariance(P_);
    }